

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromDar(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *pMan_local;
  Abc_Ntk_t *pNtkOld_local;
  
  if (pMan->nAsserts == 0) {
    pNtk = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pNtk->nConstrs = pMan->nConstrs;
    pNtk->nBarBufs = pNtkOld->nBarBufs;
    pAVar2 = Abc_AigConst1(pNtk);
    pAVar3 = Aig_ManConst1(pMan);
    (pAVar3->field_5).pData = pAVar2;
    for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar4 = Vec_PtrEntry(pMan->vCis,local_34);
      pAVar2 = Abc_NtkCi(pNtk,local_34);
      *(Abc_Obj_t **)((long)pvVar4 + 0x28) = pAVar2;
      *(uint *)(*(long *)((long)pvVar4 + 0x28) + 0x14) =
           *(uint *)(*(long *)((long)pvVar4 + 0x28) + 0x14) & 0xfff |
           (int)((ulong)*(undefined8 *)((long)pvVar4 + 0x18) >> 0x20) << 0xc;
    }
    p = Aig_ManDfs(pMan,1);
    for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_34);
      iVar1 = Aig_ObjIsBuf(pAVar3);
      if (iVar1 == 0) {
        pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
        pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
        pAVar6 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar3);
        pAVar2 = Abc_AigAnd(pMan_00,pAVar2,pAVar6);
        (pAVar3->field_5).pData = pAVar2;
      }
      else {
        pAVar5 = Aig_ObjChild0Copy(pAVar3);
        (pAVar3->field_5).pData = pAVar5;
      }
    }
    Vec_PtrFree(p);
    for (local_34 = 0;
        (iVar1 = Vec_PtrSize(pMan->vCos), local_34 < iVar1 &&
        ((pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,local_34), pMan->nAsserts == 0 ||
         (iVar1 = Aig_ManCoNum(pMan), local_34 != iVar1 - pMan->nAsserts))));
        local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_34);
      pAVar6 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
      Abc_ObjAddFanin(pAVar2,pAVar6);
    }
    iVar1 = Abc_NtkCheck(pNtk);
    if (iVar1 == 0) {
      Abc_Print(1,"Abc_NtkFromDar(): Network check has failed.\n");
    }
    return pNtk;
  }
  __assert_fail("pMan->nAsserts == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x1a5,"Abc_Ntk_t *Abc_NtkFromDar(Abc_Ntk_t *, Aig_Man_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDar( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Aig_Obj_t * pObj;
    int i;
    assert( pMan->nAsserts == 0 );
//    assert( Aig_ManRegNum(pMan) == Abc_NtkLatchNum(pNtkOld) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pNtkOld->nBarBufs;
    // transfer the pointers to the basic nodes
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachCi( pMan, pObj, i )
    {
        pObj->pData = Abc_NtkCi(pNtkNew, i);
        // initialize logic level of the CIs
        ((Abc_Obj_t *)pObj->pData)->Level = pObj->Level;
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        if ( pMan->nAsserts && i == Aig_ManCoNum(pMan) - pMan->nAsserts )
            break;
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), (Abc_Obj_t *)Aig_ObjChild0Copy(pObj) );
    }
    // if there are assertions, add them
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );
//Abc_NtkPrintCiLevels( pNtkNew );
    return pNtkNew;
}